

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.h
# Opt level: O0

cmCommand * __thiscall cmUnsetCommand::Clone(cmUnsetCommand *this)

{
  cmCommand *this_00;
  cmUnsetCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmUnsetCommand((cmUnsetCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmUnsetCommand; }